

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_error_offset(sqlite3 *db)

{
  int iVar1;
  long in_RDI;
  int iOffset;
  sqlite3 *in_stack_ffffffffffffffe8;
  undefined4 local_c;
  
  local_c = -1;
  if (in_RDI != 0) {
    iVar1 = sqlite3SafetyCheckSickOrOk(in_stack_ffffffffffffffe8);
    if ((iVar1 != 0) && (*(int *)(in_RDI + 0x50) != 0)) {
      sqlite3_mutex_enter((sqlite3_mutex *)0x14cb95);
      local_c = *(int *)(in_RDI + 0x54);
      sqlite3_mutex_leave((sqlite3_mutex *)0x14cbaf);
    }
  }
  return local_c;
}

Assistant:

SQLITE_API int sqlite3_error_offset(sqlite3 *db){
  int iOffset = -1;
  if( db && sqlite3SafetyCheckSickOrOk(db) && db->errCode ){
    sqlite3_mutex_enter(db->mutex);
    iOffset = db->errByteOffset;
    sqlite3_mutex_leave(db->mutex);
  }
  return iOffset;
}